

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Scaler::Scaler(Scaler *this,Scaler *from)

{
  int iVar1;
  void *pvVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Scaler_007082c8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->shiftvalue_).current_size_ = 0;
  (this->shiftvalue_).total_size_ = 0;
  (this->shiftvalue_).rep_ = (Rep *)0x0;
  iVar1 = (from->shiftvalue_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->shiftvalue_,iVar1);
    memcpy(((this->shiftvalue_).rep_)->elements,((from->shiftvalue_).rep_)->elements,
           (long)(from->shiftvalue_).current_size_ << 3);
    (this->shiftvalue_).current_size_ = (from->shiftvalue_).current_size_;
  }
  (this->scalevalue_).current_size_ = 0;
  (this->scalevalue_).total_size_ = 0;
  (this->scalevalue_).rep_ = (Rep *)0x0;
  iVar1 = (from->scalevalue_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->scalevalue_,iVar1);
    memcpy(((this->scalevalue_).rep_)->elements,((from->scalevalue_).rep_)->elements,
           (long)(from->scalevalue_).current_size_ << 3);
    (this->scalevalue_).current_size_ = (from->scalevalue_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

Scaler::Scaler(const Scaler& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      shiftvalue_(from.shiftvalue_),
      scalevalue_(from.scalevalue_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Scaler)
}